

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::QuadMiMBIntersectorKMoeller<4,_8,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Scene *pSVar8;
  Ref<embree::Geometry> *pRVar9;
  Geometry *pGVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  RTCFilterFunctionN p_Var14;
  undefined1 auVar15 [16];
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 (*pauVar33) [16];
  int iVar34;
  uint uVar35;
  AABBNodeMB4D *node1;
  ulong uVar36;
  long lVar37;
  long lVar38;
  uint uVar39;
  ulong uVar40;
  ulong uVar41;
  long lVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  long lVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  ulong uVar58;
  ulong uVar59;
  ulong uVar60;
  undefined1 (*pauVar61) [16];
  vint4 bi_1;
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [64];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  vint4 bi;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [32];
  vint4 ai;
  undefined1 auVar85 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [64];
  float fVar98;
  undefined1 auVar99 [16];
  undefined1 auVar100 [32];
  float fVar102;
  float fVar103;
  float fVar104;
  undefined1 auVar101 [64];
  undefined1 auVar105 [16];
  undefined1 auVar106 [32];
  uint uVar108;
  uint uVar109;
  undefined1 auVar107 [64];
  undefined1 auVar110 [32];
  undefined1 auVar111 [64];
  undefined1 auVar112 [16];
  undefined1 auVar113 [32];
  undefined1 auVar114 [64];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [64];
  undefined4 uVar119;
  undefined1 auVar120 [16];
  undefined1 auVar121 [32];
  undefined1 auVar122 [64];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [16];
  undefined1 auVar126 [32];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  RTCFilterFunctionNArguments local_14f0;
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined1 local_1440 [16];
  undefined1 local_1430 [16];
  undefined1 local_1420 [16];
  undefined1 local_1410 [16];
  undefined1 local_1400 [16];
  undefined1 local_13f0 [16];
  undefined1 local_13e0 [16];
  undefined1 local_13d0 [16];
  undefined1 local_13c0 [16];
  undefined1 local_13b0 [16];
  undefined1 local_13a0 [16];
  undefined1 local_1390 [16];
  undefined1 local_1380 [16];
  undefined1 local_1370 [16];
  undefined1 local_1360 [16];
  undefined1 local_1350 [16];
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  undefined1 local_1200 [32];
  undefined1 local_11e0 [32];
  undefined1 local_11c0 [32];
  undefined1 local_11a0 [32];
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  RTCHitN local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  undefined4 local_1040;
  undefined4 uStack_103c;
  undefined4 uStack_1038;
  undefined4 uStack_1034;
  undefined4 uStack_1030;
  undefined4 uStack_102c;
  undefined4 uStack_1028;
  undefined4 uStack_1024;
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  uint local_fe0;
  uint uStack_fdc;
  uint uStack_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  uint uStack_fc8;
  uint uStack_fc4;
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  undefined1 auVar79 [32];
  undefined1 auVar84 [32];
  
  pauVar61 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_13e0._4_4_ = fVar1;
  local_13e0._0_4_ = fVar1;
  local_13e0._8_4_ = fVar1;
  local_13e0._12_4_ = fVar1;
  auVar97 = ZEXT1664(local_13e0);
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_13f0._4_4_ = fVar2;
  local_13f0._0_4_ = fVar2;
  local_13f0._8_4_ = fVar2;
  local_13f0._12_4_ = fVar2;
  auVar101 = ZEXT1664(local_13f0);
  fVar98 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_1400._4_4_ = fVar98;
  local_1400._0_4_ = fVar98;
  local_1400._8_4_ = fVar98;
  local_1400._12_4_ = fVar98;
  auVar107 = ZEXT1664(local_1400);
  fVar1 = fVar1 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar98 = fVar98 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uVar54 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar59 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar44 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  iVar34 = (tray->tfar).field_0.i[k];
  auVar68 = ZEXT1664(CONCAT412(iVar34,CONCAT48(iVar34,CONCAT44(iVar34,iVar34))));
  local_1410._0_8_ = CONCAT44(fVar1,fVar1) ^ 0x8000000080000000;
  local_1410._8_4_ = -fVar1;
  local_1410._12_4_ = -fVar1;
  auVar111 = ZEXT1664(local_1410);
  local_1420._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  local_1420._8_4_ = -fVar2;
  local_1420._12_4_ = -fVar2;
  auVar114 = ZEXT1664(local_1420);
  local_1430._0_8_ = CONCAT44(fVar98,fVar98) ^ 0x8000000080000000;
  local_1430._8_4_ = -fVar98;
  local_1430._12_4_ = -fVar98;
  auVar118 = ZEXT1664(local_1430);
  iVar34 = (tray->tnear).field_0.i[k];
  local_1440._4_4_ = iVar34;
  local_1440._0_4_ = iVar34;
  local_1440._8_4_ = iVar34;
  local_1440._12_4_ = iVar34;
  auVar122 = ZEXT1664(local_1440);
  local_1100._16_16_ = mm_lookupmask_ps._240_16_;
  local_1100._0_16_ = mm_lookupmask_ps._0_16_;
  iVar34 = 1 << ((uint)k & 0x1f);
  auVar96._4_4_ = iVar34;
  auVar96._0_4_ = iVar34;
  auVar96._8_4_ = iVar34;
  auVar96._12_4_ = iVar34;
  auVar96._16_4_ = iVar34;
  auVar96._20_4_ = iVar34;
  auVar96._24_4_ = iVar34;
  auVar96._28_4_ = iVar34;
  auVar65 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar96 = vpand_avx2(auVar96,auVar65);
  local_1140 = vpcmpeqd_avx2(auVar96,auVar65);
  auVar76._8_4_ = 0x3f800000;
  auVar76._0_8_ = 0x3f8000003f800000;
  auVar76._12_4_ = 0x3f800000;
  auVar76._16_4_ = 0x3f800000;
  auVar76._20_4_ = 0x3f800000;
  auVar76._24_4_ = 0x3f800000;
  auVar76._28_4_ = 0x3f800000;
  auVar65._8_4_ = 0xbf800000;
  auVar65._0_8_ = 0xbf800000bf800000;
  auVar65._12_4_ = 0xbf800000;
  auVar65._16_4_ = 0xbf800000;
  auVar65._20_4_ = 0xbf800000;
  auVar65._24_4_ = 0xbf800000;
  auVar65._28_4_ = 0xbf800000;
  local_1120 = vblendvps_avx(auVar76,auVar65,local_1100);
LAB_0160c1b6:
  do {
    do {
      if (pauVar61 == (undefined1 (*) [16])&local_fa0) {
        return;
      }
      pauVar33 = pauVar61 + -1;
      pauVar61 = pauVar61 + -1;
    } while (*(float *)(ray + k * 4 + 0x100) < *(float *)(*pauVar33 + 8));
    uVar41 = *(ulong *)*pauVar61;
    while ((uVar41 & 8) == 0) {
      uVar36 = uVar41 & 0xfffffffffffffff0;
      uVar119 = *(undefined4 *)(ray + k * 4 + 0xe0);
      auVar69._4_4_ = uVar119;
      auVar69._0_4_ = uVar119;
      auVar69._8_4_ = uVar119;
      auVar69._12_4_ = uVar119;
      auVar71 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar36 + 0x80 + uVar54),auVar69,
                                *(undefined1 (*) [16])(uVar36 + 0x20 + uVar54));
      auVar71 = vfmadd213ps_fma(auVar71,auVar97._0_16_,auVar111._0_16_);
      auVar70 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar36 + 0x80 + uVar59),auVar69,
                                *(undefined1 (*) [16])(uVar36 + 0x20 + uVar59));
      auVar70 = vfmadd213ps_fma(auVar70,auVar101._0_16_,auVar114._0_16_);
      auVar71 = vpmaxsd_avx(auVar71,auVar70);
      auVar70 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar36 + 0x80 + uVar44),auVar69,
                                *(undefined1 (*) [16])(uVar36 + 0x20 + uVar44));
      auVar70 = vfmadd213ps_fma(auVar70,auVar107._0_16_,auVar118._0_16_);
      auVar70 = vpmaxsd_avx(auVar70,auVar122._0_16_);
      auVar71 = vpmaxsd_avx(auVar71,auVar70);
      auVar70 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar36 + 0x80 + (uVar54 ^ 0x10)),auVar69,
                                *(undefined1 (*) [16])(uVar36 + 0x20 + (uVar54 ^ 0x10)));
      auVar70 = vfmadd213ps_fma(auVar70,auVar97._0_16_,auVar111._0_16_);
      auVar80 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar36 + 0x80 + (uVar59 ^ 0x10)),auVar69,
                                *(undefined1 (*) [16])(uVar36 + 0x20 + (uVar59 ^ 0x10)));
      auVar80 = vfmadd213ps_fma(auVar80,auVar101._0_16_,auVar114._0_16_);
      auVar70 = vpminsd_avx(auVar70,auVar80);
      auVar80 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar36 + 0x80 + (uVar44 ^ 0x10)),auVar69,
                                *(undefined1 (*) [16])(uVar36 + 0x20 + (uVar44 ^ 0x10)));
      auVar80 = vfmadd213ps_fma(auVar80,auVar107._0_16_,auVar118._0_16_);
      auVar80 = vpminsd_avx(auVar80,auVar68._0_16_);
      auVar70 = vpminsd_avx(auVar70,auVar80);
      if (((uint)uVar41 & 7) == 6) {
        auVar80 = vcmpps_avx(auVar71,auVar70,2);
        auVar70 = vcmpps_avx(*(undefined1 (*) [16])(uVar36 + 0xe0),auVar69,2);
        auVar69 = vcmpps_avx(auVar69,*(undefined1 (*) [16])(uVar36 + 0xf0),1);
        auVar70 = vandps_avx(auVar70,auVar69);
        auVar70 = vandps_avx(auVar70,auVar80);
      }
      else {
        auVar70 = vcmpps_avx(auVar71,auVar70,2);
      }
      auVar70 = vpslld_avx(auVar70,0x1f);
      uVar39 = vmovmskps_avx(auVar70);
      local_1320._0_16_ = auVar71;
      if (uVar39 == 0) goto LAB_0160c1b6;
      uVar39 = uVar39 & 0xff;
      lVar38 = 0;
      for (uVar41 = (ulong)uVar39; (uVar41 & 1) == 0; uVar41 = uVar41 >> 1 | 0x8000000000000000) {
        lVar38 = lVar38 + 1;
      }
      uVar41 = *(ulong *)(uVar36 + lVar38 * 8);
      uVar39 = uVar39 - 1 & uVar39;
      uVar40 = (ulong)uVar39;
      if (uVar39 != 0) {
        uVar35 = *(uint *)(local_1320 + lVar38 * 4);
        lVar38 = 0;
        for (; (uVar40 & 1) == 0; uVar40 = uVar40 >> 1 | 0x8000000000000000) {
          lVar38 = lVar38 + 1;
        }
        uVar39 = uVar39 - 1 & uVar39;
        uVar43 = (ulong)uVar39;
        uVar40 = *(ulong *)(uVar36 + lVar38 * 8);
        uVar108 = *(uint *)(local_1320 + lVar38 * 4);
        if (uVar39 == 0) {
          if (uVar35 < uVar108) {
            *(ulong *)*pauVar61 = uVar40;
            *(uint *)(*pauVar61 + 8) = uVar108;
            pauVar61 = pauVar61 + 1;
          }
          else {
            *(ulong *)*pauVar61 = uVar41;
            *(uint *)(*pauVar61 + 8) = uVar35;
            uVar41 = uVar40;
            pauVar61 = pauVar61 + 1;
          }
        }
        else {
          auVar71._8_8_ = 0;
          auVar71._0_8_ = uVar41;
          auVar71 = vpunpcklqdq_avx(auVar71,ZEXT416(uVar35));
          auVar70._8_8_ = 0;
          auVar70._0_8_ = uVar40;
          auVar70 = vpunpcklqdq_avx(auVar70,ZEXT416(uVar108));
          lVar38 = 0;
          for (; (uVar43 & 1) == 0; uVar43 = uVar43 >> 1 | 0x8000000000000000) {
            lVar38 = lVar38 + 1;
          }
          uVar39 = uVar39 - 1 & uVar39;
          uVar41 = (ulong)uVar39;
          auVar80._8_8_ = 0;
          auVar80._0_8_ = *(ulong *)(uVar36 + lVar38 * 8);
          auVar69 = vpunpcklqdq_avx(auVar80,ZEXT416(*(uint *)(local_1320 + lVar38 * 4)));
          auVar80 = vpcmpgtd_avx(auVar70,auVar71);
          if (uVar39 == 0) {
            auVar89 = vpshufd_avx(auVar80,0xaa);
            auVar80 = vblendvps_avx(auVar70,auVar71,auVar89);
            auVar71 = vblendvps_avx(auVar71,auVar70,auVar89);
            auVar70 = vpcmpgtd_avx(auVar69,auVar80);
            auVar89 = vpshufd_avx(auVar70,0xaa);
            auVar70 = vblendvps_avx(auVar69,auVar80,auVar89);
            auVar80 = vblendvps_avx(auVar80,auVar69,auVar89);
            auVar69 = vpcmpgtd_avx(auVar80,auVar71);
            auVar89 = vpshufd_avx(auVar69,0xaa);
            auVar69 = vblendvps_avx(auVar80,auVar71,auVar89);
            auVar71 = vblendvps_avx(auVar71,auVar80,auVar89);
            *pauVar61 = auVar71;
            pauVar61[1] = auVar69;
            uVar41 = auVar70._0_8_;
            pauVar61 = pauVar61 + 2;
          }
          else {
            lVar38 = 0;
            for (; (uVar41 & 1) == 0; uVar41 = uVar41 >> 1 | 0x8000000000000000) {
              lVar38 = lVar38 + 1;
            }
            auVar89._8_8_ = 0;
            auVar89._0_8_ = *(ulong *)(uVar36 + lVar38 * 8);
            auVar62 = vpunpcklqdq_avx(auVar89,ZEXT416(*(uint *)(local_1320 + lVar38 * 4)));
            auVar89 = vpshufd_avx(auVar80,0xaa);
            auVar80 = vblendvps_avx(auVar70,auVar71,auVar89);
            auVar71 = vblendvps_avx(auVar71,auVar70,auVar89);
            auVar70 = vpcmpgtd_avx(auVar62,auVar69);
            auVar89 = vpshufd_avx(auVar70,0xaa);
            auVar70 = vblendvps_avx(auVar62,auVar69,auVar89);
            auVar69 = vblendvps_avx(auVar69,auVar62,auVar89);
            auVar89 = vpcmpgtd_avx(auVar69,auVar71);
            auVar62 = vpshufd_avx(auVar89,0xaa);
            auVar89 = vblendvps_avx(auVar69,auVar71,auVar62);
            auVar71 = vblendvps_avx(auVar71,auVar69,auVar62);
            auVar69 = vpcmpgtd_avx(auVar70,auVar80);
            auVar62 = vpshufd_avx(auVar69,0xaa);
            auVar69 = vblendvps_avx(auVar70,auVar80,auVar62);
            auVar70 = vblendvps_avx(auVar80,auVar70,auVar62);
            auVar80 = vpcmpgtd_avx(auVar89,auVar70);
            auVar62 = vpshufd_avx(auVar80,0xaa);
            auVar80 = vblendvps_avx(auVar89,auVar70,auVar62);
            auVar70 = vblendvps_avx(auVar70,auVar89,auVar62);
            *pauVar61 = auVar71;
            pauVar61[1] = auVar70;
            pauVar61[2] = auVar80;
            uVar41 = auVar69._0_8_;
            pauVar61 = pauVar61 + 3;
          }
        }
      }
    }
    uVar36 = uVar41 & 0xfffffffffffffff0;
    for (lVar38 = 0; lVar38 != (ulong)((uint)uVar41 & 0xf) - 8; lVar38 = lVar38 + 1) {
      lVar37 = lVar38 * 0x60;
      pSVar8 = context->scene;
      pRVar9 = (pSVar8->geometries).items;
      pGVar10 = pRVar9[*(uint *)(uVar36 + 0x40 + lVar37)].ptr;
      fVar1 = (pGVar10->time_range).lower;
      fVar1 = pGVar10->fnumTimeSegments *
              ((*(float *)(ray + k * 4 + 0xe0) - fVar1) / ((pGVar10->time_range).upper - fVar1));
      auVar71 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),9);
      auVar71 = vminss_avx(auVar71,ZEXT416((uint)(pGVar10->fnumTimeSegments + -1.0)));
      auVar15 = vmaxss_avx(ZEXT816(0) << 0x20,auVar71);
      iVar34 = (int)auVar15._0_4_;
      lVar51 = (long)iVar34 * 0x38;
      lVar11 = *(long *)(*(long *)&pGVar10[2].numPrimitives + lVar51);
      uVar55 = (ulong)*(uint *)(uVar36 + 4 + lVar37);
      auVar71 = *(undefined1 (*) [16])(lVar11 + (ulong)*(uint *)(uVar36 + lVar37) * 4);
      uVar43 = (ulong)*(uint *)(uVar36 + 0x10 + lVar37);
      auVar70 = *(undefined1 (*) [16])(lVar11 + uVar43 * 4);
      uVar45 = (ulong)*(uint *)(uVar36 + 0x20 + lVar37);
      auVar80 = *(undefined1 (*) [16])(lVar11 + uVar45 * 4);
      uVar46 = (ulong)*(uint *)(uVar36 + 0x30 + lVar37);
      auVar69 = *(undefined1 (*) [16])(lVar11 + uVar46 * 4);
      lVar11 = *(long *)&pRVar9[*(uint *)(uVar36 + 0x44 + lVar37)].ptr[2].numPrimitives;
      lVar12 = *(long *)(lVar11 + lVar51);
      auVar89 = *(undefined1 (*) [16])(lVar12 + uVar55 * 4);
      uVar47 = (ulong)*(uint *)(uVar36 + 0x14 + lVar37);
      auVar62 = *(undefined1 (*) [16])(lVar12 + uVar47 * 4);
      uVar48 = (ulong)*(uint *)(uVar36 + 0x24 + lVar37);
      auVar75 = *(undefined1 (*) [16])(lVar12 + uVar48 * 4);
      uVar49 = (ulong)*(uint *)(uVar36 + 0x34 + lVar37);
      auVar82 = *(undefined1 (*) [16])(lVar12 + uVar49 * 4);
      lVar12 = *(long *)&pRVar9[*(uint *)(uVar36 + 0x48 + lVar37)].ptr[2].numPrimitives;
      lVar13 = *(long *)(lVar12 + lVar51);
      uVar50 = (ulong)*(uint *)(uVar36 + 8 + lVar37);
      auVar4 = *(undefined1 (*) [16])(lVar13 + uVar50 * 4);
      uVar56 = (ulong)*(uint *)(uVar36 + 0x18 + lVar37);
      auVar5 = *(undefined1 (*) [16])(lVar13 + uVar56 * 4);
      uVar57 = (ulong)*(uint *)(uVar36 + 0x28 + lVar37);
      auVar6 = *(undefined1 (*) [16])(lVar13 + uVar57 * 4);
      uVar58 = (ulong)*(uint *)(uVar36 + 0x38 + lVar37);
      auVar7 = *(undefined1 (*) [16])(lVar13 + uVar58 * 4);
      fVar1 = fVar1 - auVar15._0_4_;
      lVar13 = *(long *)&pRVar9[*(uint *)(uVar36 + 0x4c + lVar37)].ptr[2].numPrimitives;
      lVar51 = *(long *)(lVar13 + lVar51);
      uVar40 = (ulong)*(uint *)(uVar36 + 0xc + lVar37);
      auVar15 = *(undefined1 (*) [16])(lVar51 + uVar40 * 4);
      uVar52 = (ulong)*(uint *)(uVar36 + 0x1c + lVar37);
      auVar74 = *(undefined1 (*) [16])(lVar51 + uVar52 * 4);
      auVar90 = vunpcklps_avx(auVar71,auVar4);
      auVar4 = vunpckhps_avx(auVar71,auVar4);
      auVar99 = vunpcklps_avx(auVar89,auVar15);
      auVar89 = vunpckhps_avx(auVar89,auVar15);
      uVar53 = (ulong)*(uint *)(uVar36 + 0x2c + lVar37);
      auVar71 = *(undefined1 (*) [16])(lVar51 + uVar53 * 4);
      local_1360 = vunpcklps_avx(auVar4,auVar89);
      local_13a0 = vunpcklps_avx(auVar90,auVar99);
      local_1380 = vunpckhps_avx(auVar90,auVar99);
      auVar4 = vunpcklps_avx(auVar70,auVar5);
      auVar89 = vunpckhps_avx(auVar70,auVar5);
      auVar5 = vunpcklps_avx(auVar62,auVar74);
      auVar62 = vunpckhps_avx(auVar62,auVar74);
      uVar60 = (ulong)*(uint *)(uVar36 + 0x3c + lVar37);
      auVar70 = *(undefined1 (*) [16])(lVar51 + uVar60 * 4);
      local_1350 = vunpcklps_avx(auVar89,auVar62);
      local_1390 = vunpcklps_avx(auVar4,auVar5);
      local_1370 = vunpckhps_avx(auVar4,auVar5);
      auVar62 = vunpcklps_avx(auVar80,auVar6);
      auVar80 = vunpckhps_avx(auVar80,auVar6);
      auVar4 = vunpcklps_avx(auVar75,auVar71);
      auVar89 = vunpckhps_avx(auVar75,auVar71);
      lVar42 = (long)(iVar34 + 1) * 0x38;
      lVar51 = *(long *)(*(long *)&pGVar10[2].numPrimitives + lVar42);
      auVar71 = *(undefined1 (*) [16])(lVar51 + (ulong)*(uint *)(uVar36 + lVar37) * 4);
      auVar75 = vunpcklps_avx(auVar80,auVar89);
      local_13c0 = vunpcklps_avx(auVar62,auVar4);
      local_13b0 = vunpckhps_avx(auVar62,auVar4);
      auVar89 = vunpcklps_avx(auVar69,auVar7);
      auVar80 = vunpckhps_avx(auVar69,auVar7);
      auVar62 = vunpcklps_avx(auVar82,auVar70);
      auVar69 = vunpckhps_avx(auVar82,auVar70);
      lVar12 = *(long *)(lVar12 + lVar42);
      auVar70 = *(undefined1 (*) [16])(lVar12 + uVar50 * 4);
      auVar82 = vunpcklps_avx(auVar80,auVar69);
      auVar4 = vunpcklps_avx(auVar89,auVar62);
      local_13d0 = vunpckhps_avx(auVar89,auVar62);
      lVar11 = *(long *)(lVar11 + lVar42);
      auVar69 = vunpcklps_avx(auVar71,auVar70);
      auVar80 = vunpckhps_avx(auVar71,auVar70);
      auVar71 = *(undefined1 (*) [16])(lVar11 + uVar55 * 4);
      lVar13 = *(long *)(lVar13 + lVar42);
      auVar70 = *(undefined1 (*) [16])(lVar13 + uVar40 * 4);
      auVar89 = vunpcklps_avx(auVar71,auVar70);
      auVar71 = vunpckhps_avx(auVar71,auVar70);
      auVar5 = vunpcklps_avx(auVar80,auVar71);
      auVar6 = vunpcklps_avx(auVar69,auVar89);
      auVar80 = vunpckhps_avx(auVar69,auVar89);
      auVar71 = *(undefined1 (*) [16])(lVar51 + uVar43 * 4);
      auVar70 = *(undefined1 (*) [16])(lVar12 + uVar56 * 4);
      auVar89 = vunpcklps_avx(auVar71,auVar70);
      auVar69 = vunpckhps_avx(auVar71,auVar70);
      auVar71 = *(undefined1 (*) [16])(lVar11 + uVar47 * 4);
      auVar70 = *(undefined1 (*) [16])(lVar13 + uVar52 * 4);
      auVar62 = vunpcklps_avx(auVar71,auVar70);
      auVar71 = vunpckhps_avx(auVar71,auVar70);
      auVar7 = vunpcklps_avx(auVar69,auVar71);
      auVar15 = vunpcklps_avx(auVar89,auVar62);
      auVar69 = vunpckhps_avx(auVar89,auVar62);
      auVar71 = *(undefined1 (*) [16])(lVar51 + uVar45 * 4);
      auVar70 = *(undefined1 (*) [16])(lVar12 + uVar57 * 4);
      auVar62 = vunpcklps_avx(auVar71,auVar70);
      auVar89 = vunpckhps_avx(auVar71,auVar70);
      auVar71 = *(undefined1 (*) [16])(lVar11 + uVar48 * 4);
      auVar70 = *(undefined1 (*) [16])(lVar13 + uVar53 * 4);
      auVar74 = vunpcklps_avx(auVar71,auVar70);
      auVar71 = vunpckhps_avx(auVar71,auVar70);
      auVar90 = vunpcklps_avx(auVar89,auVar71);
      auVar99 = vunpcklps_avx(auVar62,auVar74);
      auVar89 = vunpckhps_avx(auVar62,auVar74);
      auVar71 = *(undefined1 (*) [16])(lVar51 + uVar46 * 4);
      auVar70 = *(undefined1 (*) [16])(lVar12 + uVar58 * 4);
      auVar74 = vunpcklps_avx(auVar71,auVar70);
      auVar62 = vunpckhps_avx(auVar71,auVar70);
      auVar71 = *(undefined1 (*) [16])(lVar11 + uVar49 * 4);
      auVar70 = *(undefined1 (*) [16])(lVar13 + uVar60 * 4);
      auVar72 = vunpcklps_avx(auVar71,auVar70);
      auVar71 = vunpckhps_avx(auVar71,auVar70);
      auVar70 = vunpcklps_avx(auVar62,auVar71);
      auVar62 = vunpcklps_avx(auVar74,auVar72);
      auVar71 = vunpckhps_avx(auVar74,auVar72);
      fVar2 = 1.0 - fVar1;
      auVar72._4_4_ = fVar2;
      auVar72._0_4_ = fVar2;
      auVar72._8_4_ = fVar2;
      auVar72._12_4_ = fVar2;
      auVar81._0_4_ = fVar1 * auVar6._0_4_;
      auVar81._4_4_ = fVar1 * auVar6._4_4_;
      auVar81._8_4_ = fVar1 * auVar6._8_4_;
      auVar81._12_4_ = fVar1 * auVar6._12_4_;
      auVar6 = vfmadd231ps_fma(auVar81,auVar72,local_13a0);
      auVar91._0_4_ = fVar1 * auVar80._0_4_;
      auVar91._4_4_ = fVar1 * auVar80._4_4_;
      auVar91._8_4_ = fVar1 * auVar80._8_4_;
      auVar91._12_4_ = fVar1 * auVar80._12_4_;
      auVar80 = vfmadd231ps_fma(auVar91,auVar72,local_1380);
      auVar85._0_4_ = auVar5._0_4_ * fVar1;
      auVar85._4_4_ = auVar5._4_4_ * fVar1;
      auVar85._8_4_ = auVar5._8_4_ * fVar1;
      auVar85._12_4_ = auVar5._12_4_ * fVar1;
      auVar5 = vfmadd231ps_fma(auVar85,auVar72,local_1360);
      auVar74._0_4_ = fVar1 * auVar15._0_4_;
      auVar74._4_4_ = fVar1 * auVar15._4_4_;
      auVar74._8_4_ = fVar1 * auVar15._8_4_;
      auVar74._12_4_ = fVar1 * auVar15._12_4_;
      auVar15 = vfmadd231ps_fma(auVar74,auVar72,local_1390);
      auVar93._0_4_ = fVar1 * auVar69._0_4_;
      auVar93._4_4_ = fVar1 * auVar69._4_4_;
      auVar93._8_4_ = fVar1 * auVar69._8_4_;
      auVar93._12_4_ = fVar1 * auVar69._12_4_;
      auVar69 = vfmadd231ps_fma(auVar93,auVar72,local_1370);
      auVar120._0_4_ = auVar7._0_4_ * fVar1;
      auVar120._4_4_ = auVar7._4_4_ * fVar1;
      auVar120._8_4_ = auVar7._8_4_ * fVar1;
      auVar120._12_4_ = auVar7._12_4_ * fVar1;
      auVar7 = vfmadd231ps_fma(auVar120,auVar72,local_1350);
      auVar105._0_4_ = auVar99._0_4_ * fVar1;
      auVar105._4_4_ = auVar99._4_4_ * fVar1;
      auVar105._8_4_ = auVar99._8_4_ * fVar1;
      auVar105._12_4_ = auVar99._12_4_ * fVar1;
      auVar74 = vfmadd231ps_fma(auVar105,auVar72,local_13c0);
      auVar112._0_4_ = auVar89._0_4_ * fVar1;
      auVar112._4_4_ = auVar89._4_4_ * fVar1;
      auVar112._8_4_ = auVar89._8_4_ * fVar1;
      auVar112._12_4_ = auVar89._12_4_ * fVar1;
      auVar89 = vfmadd231ps_fma(auVar112,auVar72,local_13b0);
      auVar125._0_4_ = auVar90._0_4_ * fVar1;
      auVar125._4_4_ = auVar90._4_4_ * fVar1;
      auVar125._8_4_ = auVar90._8_4_ * fVar1;
      auVar125._12_4_ = auVar90._12_4_ * fVar1;
      auVar75 = vfmadd231ps_fma(auVar125,auVar72,auVar75);
      auVar90._0_4_ = fVar1 * auVar62._0_4_;
      auVar90._4_4_ = fVar1 * auVar62._4_4_;
      auVar90._8_4_ = fVar1 * auVar62._8_4_;
      auVar90._12_4_ = fVar1 * auVar62._12_4_;
      auVar99._0_4_ = auVar71._0_4_ * fVar1;
      auVar99._4_4_ = auVar71._4_4_ * fVar1;
      auVar99._8_4_ = auVar71._8_4_ * fVar1;
      auVar99._12_4_ = auVar71._12_4_ * fVar1;
      auVar62._0_4_ = auVar70._0_4_ * fVar1;
      auVar62._4_4_ = auVar70._4_4_ * fVar1;
      auVar62._8_4_ = auVar70._8_4_ * fVar1;
      auVar62._12_4_ = auVar70._12_4_ * fVar1;
      auVar71 = vfmadd231ps_fma(auVar90,auVar72,auVar4);
      auVar70 = vfmadd231ps_fma(auVar99,auVar72,local_13d0);
      lVar11 = uVar36 + 0x40 + lVar37;
      local_10e0 = *(undefined8 *)(lVar11 + 0x10);
      uStack_10d8 = *(undefined8 *)(lVar11 + 0x18);
      uStack_10d0 = local_10e0;
      uStack_10c8 = uStack_10d8;
      lVar37 = uVar36 + 0x50 + lVar37;
      local_1340 = *(undefined8 *)(lVar37 + 0x10);
      uStack_1338 = *(undefined8 *)(lVar37 + 0x18);
      auVar62 = vfmadd231ps_fma(auVar62,auVar72,auVar82);
      uStack_1330 = local_1340;
      uStack_1328 = uStack_1338;
      auVar115._16_16_ = auVar74;
      auVar115._0_16_ = auVar6;
      auVar123._16_16_ = auVar89;
      auVar123._0_16_ = auVar80;
      auVar126._16_16_ = auVar75;
      auVar126._0_16_ = auVar5;
      auVar73._16_16_ = auVar15;
      auVar73._0_16_ = auVar15;
      auVar77._16_16_ = auVar69;
      auVar77._0_16_ = auVar69;
      auVar83._16_16_ = auVar7;
      auVar83._0_16_ = auVar7;
      auVar86._16_16_ = auVar71;
      auVar86._0_16_ = auVar71;
      auVar94._16_16_ = auVar70;
      auVar94._0_16_ = auVar70;
      auVar63._16_16_ = auVar62;
      auVar63._0_16_ = auVar62;
      auVar65 = vsubps_avx(auVar115,auVar73);
      auVar96 = vsubps_avx(auVar123,auVar77);
      auVar76 = vsubps_avx(auVar126,auVar83);
      auVar73 = vsubps_avx(auVar86,auVar115);
      auVar21 = vsubps_avx(auVar94,auVar123);
      auVar22 = vsubps_avx(auVar63,auVar126);
      auVar23._4_4_ = auVar96._4_4_ * auVar22._4_4_;
      auVar23._0_4_ = auVar96._0_4_ * auVar22._0_4_;
      auVar23._8_4_ = auVar96._8_4_ * auVar22._8_4_;
      auVar23._12_4_ = auVar96._12_4_ * auVar22._12_4_;
      auVar23._16_4_ = auVar96._16_4_ * auVar22._16_4_;
      auVar23._20_4_ = auVar96._20_4_ * auVar22._20_4_;
      auVar23._24_4_ = auVar96._24_4_ * auVar22._24_4_;
      auVar23._28_4_ = auVar62._12_4_;
      auVar69 = vfmsub231ps_fma(auVar23,auVar21,auVar76);
      auVar24._4_4_ = auVar76._4_4_ * auVar73._4_4_;
      auVar24._0_4_ = auVar76._0_4_ * auVar73._0_4_;
      auVar24._8_4_ = auVar76._8_4_ * auVar73._8_4_;
      auVar24._12_4_ = auVar76._12_4_ * auVar73._12_4_;
      auVar24._16_4_ = auVar76._16_4_ * auVar73._16_4_;
      auVar24._20_4_ = auVar76._20_4_ * auVar73._20_4_;
      auVar24._24_4_ = auVar76._24_4_ * auVar73._24_4_;
      auVar24._28_4_ = auVar15._12_4_;
      auVar62 = vfmsub231ps_fma(auVar24,auVar22,auVar65);
      uVar119 = *(undefined4 *)(ray + k * 4);
      auVar78._4_4_ = uVar119;
      auVar78._0_4_ = uVar119;
      auVar78._8_4_ = uVar119;
      auVar78._12_4_ = uVar119;
      auVar78._16_4_ = uVar119;
      auVar78._20_4_ = uVar119;
      auVar78._24_4_ = uVar119;
      auVar78._28_4_ = uVar119;
      uVar119 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar87._4_4_ = uVar119;
      auVar87._0_4_ = uVar119;
      auVar87._8_4_ = uVar119;
      auVar87._12_4_ = uVar119;
      auVar87._16_4_ = uVar119;
      auVar87._20_4_ = uVar119;
      auVar87._24_4_ = uVar119;
      auVar87._28_4_ = uVar119;
      uVar119 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar95._4_4_ = uVar119;
      auVar95._0_4_ = uVar119;
      auVar95._8_4_ = uVar119;
      auVar95._12_4_ = uVar119;
      auVar95._16_4_ = uVar119;
      auVar95._20_4_ = uVar119;
      auVar95._24_4_ = uVar119;
      auVar95._28_4_ = uVar119;
      fVar1 = *(float *)(ray + k * 4 + 0x80);
      auVar110._4_4_ = fVar1;
      auVar110._0_4_ = fVar1;
      auVar110._8_4_ = fVar1;
      auVar110._12_4_ = fVar1;
      auVar110._16_4_ = fVar1;
      auVar110._20_4_ = fVar1;
      auVar110._24_4_ = fVar1;
      auVar110._28_4_ = fVar1;
      auVar23 = vsubps_avx(auVar115,auVar78);
      fVar2 = *(float *)(ray + k * 4 + 0xa0);
      auVar116._4_4_ = fVar2;
      auVar116._0_4_ = fVar2;
      auVar116._8_4_ = fVar2;
      auVar116._12_4_ = fVar2;
      auVar116._16_4_ = fVar2;
      auVar116._20_4_ = fVar2;
      auVar116._24_4_ = fVar2;
      auVar116._28_4_ = fVar2;
      auVar24 = vsubps_avx(auVar123,auVar87);
      fVar98 = *(float *)(ray + k * 4 + 0xc0);
      auVar121._4_4_ = fVar98;
      auVar121._0_4_ = fVar98;
      auVar121._8_4_ = fVar98;
      auVar121._12_4_ = fVar98;
      auVar121._16_4_ = fVar98;
      auVar121._20_4_ = fVar98;
      auVar121._24_4_ = fVar98;
      auVar121._28_4_ = fVar98;
      auVar63 = vsubps_avx(auVar126,auVar95);
      auVar25._4_4_ = fVar1 * auVar24._4_4_;
      auVar25._0_4_ = fVar1 * auVar24._0_4_;
      auVar25._8_4_ = fVar1 * auVar24._8_4_;
      auVar25._12_4_ = fVar1 * auVar24._12_4_;
      auVar25._16_4_ = fVar1 * auVar24._16_4_;
      auVar25._20_4_ = fVar1 * auVar24._20_4_;
      auVar25._24_4_ = fVar1 * auVar24._24_4_;
      auVar25._28_4_ = auVar89._12_4_;
      auVar71 = vfmsub231ps_fma(auVar25,auVar23,auVar116);
      auVar26._4_4_ = auVar22._4_4_ * auVar71._4_4_;
      auVar26._0_4_ = auVar22._0_4_ * auVar71._0_4_;
      auVar26._8_4_ = auVar22._8_4_ * auVar71._8_4_;
      auVar26._12_4_ = auVar22._12_4_ * auVar71._12_4_;
      auVar26._16_4_ = auVar22._16_4_ * 0.0;
      auVar26._20_4_ = auVar22._20_4_ * 0.0;
      auVar26._24_4_ = auVar22._24_4_ * 0.0;
      auVar26._28_4_ = auVar22._28_4_;
      auVar124._0_4_ = auVar76._0_4_ * auVar71._0_4_;
      auVar124._4_4_ = auVar76._4_4_ * auVar71._4_4_;
      auVar124._8_4_ = auVar76._8_4_ * auVar71._8_4_;
      auVar124._12_4_ = auVar76._12_4_ * auVar71._12_4_;
      auVar124._16_4_ = auVar76._16_4_ * 0.0;
      auVar124._20_4_ = auVar76._20_4_ * 0.0;
      auVar124._24_4_ = auVar76._24_4_ * 0.0;
      auVar124._28_4_ = 0;
      auVar22._4_4_ = fVar98 * auVar23._4_4_;
      auVar22._0_4_ = fVar98 * auVar23._0_4_;
      auVar22._8_4_ = fVar98 * auVar23._8_4_;
      auVar22._12_4_ = fVar98 * auVar23._12_4_;
      auVar22._16_4_ = fVar98 * auVar23._16_4_;
      auVar22._20_4_ = fVar98 * auVar23._20_4_;
      auVar22._24_4_ = fVar98 * auVar23._24_4_;
      auVar22._28_4_ = auVar76._28_4_;
      auVar70 = vfmsub231ps_fma(auVar22,auVar63,auVar110);
      auVar71 = vfmadd231ps_fma(auVar26,ZEXT1632(auVar70),auVar21);
      auVar70 = vfmadd231ps_fma(auVar124,auVar96,ZEXT1632(auVar70));
      auVar27._4_4_ = auVar65._4_4_ * auVar21._4_4_;
      auVar27._0_4_ = auVar65._0_4_ * auVar21._0_4_;
      auVar27._8_4_ = auVar65._8_4_ * auVar21._8_4_;
      auVar27._12_4_ = auVar65._12_4_ * auVar21._12_4_;
      auVar27._16_4_ = auVar65._16_4_ * auVar21._16_4_;
      auVar27._20_4_ = auVar65._20_4_ * auVar21._20_4_;
      auVar27._24_4_ = auVar65._24_4_ * auVar21._24_4_;
      auVar27._28_4_ = auVar21._28_4_;
      auVar89 = vfmsub231ps_fma(auVar27,auVar73,auVar96);
      auVar21._4_4_ = fVar2 * auVar63._4_4_;
      auVar21._0_4_ = fVar2 * auVar63._0_4_;
      auVar21._8_4_ = fVar2 * auVar63._8_4_;
      auVar21._12_4_ = fVar2 * auVar63._12_4_;
      auVar21._16_4_ = fVar2 * auVar63._16_4_;
      auVar21._20_4_ = fVar2 * auVar63._20_4_;
      auVar21._24_4_ = fVar2 * auVar63._24_4_;
      auVar21._28_4_ = auVar96._28_4_;
      auVar75 = vfmsub231ps_fma(auVar21,auVar24,auVar121);
      fVar1 = auVar89._0_4_;
      fVar2 = auVar89._4_4_;
      auVar28._4_4_ = fVar98 * fVar2;
      auVar28._0_4_ = fVar98 * fVar1;
      fVar16 = auVar89._8_4_;
      auVar28._8_4_ = fVar98 * fVar16;
      fVar17 = auVar89._12_4_;
      auVar28._12_4_ = fVar98 * fVar17;
      auVar28._16_4_ = fVar98 * 0.0;
      auVar28._20_4_ = fVar98 * 0.0;
      auVar28._24_4_ = fVar98 * 0.0;
      auVar28._28_4_ = fVar98;
      auVar80 = vfmadd231ps_fma(auVar28,ZEXT1632(auVar62),auVar116);
      auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),ZEXT1632(auVar69),auVar110);
      auVar106._8_4_ = 0x80000000;
      auVar106._0_8_ = 0x8000000080000000;
      auVar106._12_4_ = 0x80000000;
      auVar106._16_4_ = 0x80000000;
      auVar106._20_4_ = 0x80000000;
      auVar106._24_4_ = 0x80000000;
      auVar106._28_4_ = 0x80000000;
      auVar71 = vfmadd231ps_fma(ZEXT1632(auVar71),ZEXT1632(auVar75),auVar73);
      auVar96 = vandps_avx(ZEXT1632(auVar80),auVar106);
      uVar39 = auVar96._0_4_;
      auVar92._0_4_ = (float)(uVar39 ^ auVar71._0_4_);
      uVar35 = auVar96._4_4_;
      auVar92._4_4_ = (float)(uVar35 ^ auVar71._4_4_);
      uVar108 = auVar96._8_4_;
      auVar92._8_4_ = (float)(uVar108 ^ auVar71._8_4_);
      uVar109 = auVar96._12_4_;
      auVar92._12_4_ = (float)(uVar109 ^ auVar71._12_4_);
      local_12e0._16_4_ = auVar96._16_4_;
      auVar92._16_4_ = local_12e0._16_4_;
      local_12e0._20_4_ = auVar96._20_4_;
      auVar92._20_4_ = local_12e0._20_4_;
      local_12e0._24_4_ = auVar96._24_4_;
      auVar92._24_4_ = local_12e0._24_4_;
      local_12e0._28_4_ = auVar96._28_4_;
      auVar92._28_4_ = local_12e0._28_4_;
      auVar71 = vfmadd231ps_fma(ZEXT1632(auVar70),auVar65,ZEXT1632(auVar75));
      local_1300._0_4_ = (float)(uVar39 ^ auVar71._0_4_);
      local_1300._4_4_ = (float)(uVar35 ^ auVar71._4_4_);
      local_1300._8_4_ = (float)(uVar108 ^ auVar71._8_4_);
      local_1300._12_4_ = (float)(uVar109 ^ auVar71._12_4_);
      local_1300._16_4_ = local_12e0._16_4_;
      local_1300._20_4_ = local_12e0._20_4_;
      local_1300._24_4_ = local_12e0._24_4_;
      local_1300._28_4_ = local_12e0._28_4_;
      auVar96 = vcmpps_avx(auVar92,ZEXT832(0) << 0x20,5);
      auVar65 = vcmpps_avx(local_1300,ZEXT832(0) << 0x20,5);
      auVar96 = vandps_avx(auVar96,auVar65);
      auVar100._8_4_ = 0x7fffffff;
      auVar100._0_8_ = 0x7fffffff7fffffff;
      auVar100._12_4_ = 0x7fffffff;
      auVar100._16_4_ = 0x7fffffff;
      auVar100._20_4_ = 0x7fffffff;
      auVar100._24_4_ = 0x7fffffff;
      auVar100._28_4_ = 0x7fffffff;
      local_12c0 = vandps_avx(ZEXT1632(auVar80),auVar100);
      auVar65 = vcmpps_avx(ZEXT1632(auVar80),ZEXT832(0) << 0x20,4);
      auVar96 = vandps_avx(auVar96,auVar65);
      auVar113._0_4_ = auVar92._0_4_ + local_1300._0_4_;
      auVar113._4_4_ = auVar92._4_4_ + local_1300._4_4_;
      auVar113._8_4_ = auVar92._8_4_ + local_1300._8_4_;
      auVar113._12_4_ = auVar92._12_4_ + local_1300._12_4_;
      auVar113._16_4_ = local_12e0._16_4_ + local_12e0._16_4_;
      auVar113._20_4_ = local_12e0._20_4_ + local_12e0._20_4_;
      auVar113._24_4_ = local_12e0._24_4_ + local_12e0._24_4_;
      auVar113._28_4_ = local_12e0._28_4_ + local_12e0._28_4_;
      auVar65 = vcmpps_avx(auVar113,local_12c0,2);
      auVar76 = auVar65 & auVar96;
      if ((((((((auVar76 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar76 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar76 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar76 >> 0x7f,0) != '\0') ||
            (auVar76 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar76 >> 0xbf,0) != '\0') ||
          (auVar76 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar76[0x1f] < '\0') {
        auVar96 = vandps_avx(auVar96,auVar65);
        auVar71 = vpackssdw_avx(auVar96._0_16_,auVar96._16_16_);
        auVar29._4_4_ = fVar2 * auVar63._4_4_;
        auVar29._0_4_ = fVar1 * auVar63._0_4_;
        auVar29._8_4_ = fVar16 * auVar63._8_4_;
        auVar29._12_4_ = fVar17 * auVar63._12_4_;
        auVar29._16_4_ = auVar63._16_4_ * 0.0;
        auVar29._20_4_ = auVar63._20_4_ * 0.0;
        auVar29._24_4_ = auVar63._24_4_ * 0.0;
        auVar29._28_4_ = auVar63._28_4_;
        auVar70 = vfmadd213ps_fma(auVar24,ZEXT1632(auVar62),auVar29);
        auVar70 = vfmadd213ps_fma(auVar23,ZEXT1632(auVar69),ZEXT1632(auVar70));
        local_12e0._0_4_ = (float)(uVar39 ^ auVar70._0_4_);
        local_12e0._4_4_ = (float)(uVar35 ^ auVar70._4_4_);
        local_12e0._8_4_ = (float)(uVar108 ^ auVar70._8_4_);
        local_12e0._12_4_ = (float)(uVar109 ^ auVar70._12_4_);
        fVar98 = *(float *)(ray + k * 4 + 0x60);
        auVar30._4_4_ = local_12c0._4_4_ * fVar98;
        auVar30._0_4_ = local_12c0._0_4_ * fVar98;
        auVar30._8_4_ = local_12c0._8_4_ * fVar98;
        auVar30._12_4_ = local_12c0._12_4_ * fVar98;
        auVar30._16_4_ = local_12c0._16_4_ * fVar98;
        auVar30._20_4_ = local_12c0._20_4_ * fVar98;
        auVar30._24_4_ = local_12c0._24_4_ * fVar98;
        auVar30._28_4_ = fVar98;
        auVar96 = vcmpps_avx(auVar30,local_12e0,1);
        fVar98 = *(float *)(ray + k * 4 + 0x100);
        auVar68 = ZEXT3264(CONCAT428(fVar98,CONCAT424(fVar98,CONCAT420(fVar98,CONCAT416(fVar98,
                                                  CONCAT412(fVar98,CONCAT48(fVar98,CONCAT44(fVar98,
                                                  fVar98))))))));
        auVar88._0_4_ = local_12c0._0_4_ * fVar98;
        auVar88._4_4_ = local_12c0._4_4_ * fVar98;
        auVar88._8_4_ = local_12c0._8_4_ * fVar98;
        auVar88._12_4_ = local_12c0._12_4_ * fVar98;
        auVar88._16_4_ = local_12c0._16_4_ * fVar98;
        auVar88._20_4_ = local_12c0._20_4_ * fVar98;
        auVar88._24_4_ = local_12c0._24_4_ * fVar98;
        auVar88._28_4_ = 0;
        auVar65 = vcmpps_avx(local_12e0,auVar88,2);
        auVar96 = vandps_avx(auVar96,auVar65);
        auVar70 = vpackssdw_avx(auVar96._0_16_,auVar96._16_16_);
        auVar71 = vpand_avx(auVar71,auVar70);
        auVar96 = vpmovzxwd_avx2(auVar71);
        auVar96 = vpslld_avx2(auVar96,0x1f);
        if ((((((((auVar96 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar96 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar96 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar96 >> 0x7f,0) != '\0') ||
              (auVar96 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar96 >> 0xbf,0) != '\0') ||
            (auVar96 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar96[0x1f] < '\0') {
          local_14a0 = vpsrad_avx2(auVar96,0x1f);
          local_1320 = auVar92;
          local_12a0 = ZEXT1632(auVar69);
          local_1280 = ZEXT1632(auVar62);
          local_1260 = ZEXT1632(auVar89);
          local_1240 = local_14a0;
          local_1160 = local_1100;
          auVar65 = vrcpps_avx(local_12c0);
          auVar117._8_4_ = 0x3f800000;
          auVar117._0_8_ = 0x3f8000003f800000;
          auVar117._12_4_ = 0x3f800000;
          auVar117._16_4_ = 0x3f800000;
          auVar117._20_4_ = 0x3f800000;
          auVar117._24_4_ = 0x3f800000;
          auVar117._28_4_ = 0x3f800000;
          auVar70 = vfnmadd213ps_fma(local_12c0,auVar65,auVar117);
          auVar70 = vfmadd132ps_fma(ZEXT1632(auVar70),auVar65,auVar65);
          fVar98 = auVar70._0_4_;
          fVar102 = auVar70._4_4_;
          local_11e0._4_4_ = fVar102 * local_12e0._4_4_;
          local_11e0._0_4_ = fVar98 * local_12e0._0_4_;
          fVar103 = auVar70._8_4_;
          local_11e0._8_4_ = fVar103 * local_12e0._8_4_;
          fVar104 = auVar70._12_4_;
          local_11e0._12_4_ = fVar104 * local_12e0._12_4_;
          local_11e0._16_4_ = local_12e0._16_4_ * 0.0;
          local_11e0._20_4_ = local_12e0._20_4_ * 0.0;
          local_11e0._24_4_ = local_12e0._24_4_ * 0.0;
          local_11e0._28_4_ = auVar65._28_4_;
          auVar97 = ZEXT3264(local_11e0);
          auVar31._4_4_ = fVar102 * auVar92._4_4_;
          auVar31._0_4_ = fVar98 * auVar92._0_4_;
          auVar31._8_4_ = fVar103 * auVar92._8_4_;
          auVar31._12_4_ = fVar104 * auVar92._12_4_;
          auVar31._16_4_ = local_12e0._16_4_ * 0.0;
          auVar31._20_4_ = local_12e0._20_4_ * 0.0;
          auVar31._24_4_ = local_12e0._24_4_ * 0.0;
          auVar31._28_4_ = local_12e0._28_4_;
          auVar65 = vminps_avx(auVar31,auVar117);
          auVar32._4_4_ = fVar102 * local_1300._4_4_;
          auVar32._0_4_ = fVar98 * local_1300._0_4_;
          auVar32._8_4_ = fVar103 * local_1300._8_4_;
          auVar32._12_4_ = fVar104 * local_1300._12_4_;
          auVar32._16_4_ = local_12e0._16_4_ * 0.0;
          auVar32._20_4_ = local_12e0._20_4_ * 0.0;
          auVar32._24_4_ = local_12e0._24_4_ * 0.0;
          auVar32._28_4_ = local_12e0._28_4_;
          auVar76 = vminps_avx(auVar32,auVar117);
          auVar73 = vsubps_avx(auVar117,auVar65);
          auVar21 = vsubps_avx(auVar117,auVar76);
          local_1200 = vblendvps_avx(auVar76,auVar73,local_1100);
          local_1220 = vblendvps_avx(auVar65,auVar21,local_1100);
          fVar98 = local_1120._0_4_;
          local_11c0._0_4_ = auVar69._0_4_ * fVar98;
          fVar102 = local_1120._4_4_;
          local_11c0._4_4_ = auVar69._4_4_ * fVar102;
          fVar103 = local_1120._8_4_;
          local_11c0._8_4_ = auVar69._8_4_ * fVar103;
          fVar104 = local_1120._12_4_;
          local_11c0._12_4_ = auVar69._12_4_ * fVar104;
          fVar18 = local_1120._16_4_;
          local_11c0._16_4_ = fVar18 * 0.0;
          fVar19 = local_1120._20_4_;
          local_11c0._20_4_ = fVar19 * 0.0;
          fVar20 = local_1120._24_4_;
          local_11c0._24_4_ = fVar20 * 0.0;
          local_11c0._28_4_ = 0;
          local_11a0._0_4_ = fVar98 * auVar62._0_4_;
          local_11a0._4_4_ = fVar102 * auVar62._4_4_;
          local_11a0._8_4_ = fVar103 * auVar62._8_4_;
          local_11a0._12_4_ = fVar104 * auVar62._12_4_;
          local_11a0._16_4_ = fVar18 * 0.0;
          local_11a0._20_4_ = fVar19 * 0.0;
          local_11a0._24_4_ = fVar20 * 0.0;
          local_11a0._28_4_ = 0;
          local_1180._0_4_ = fVar98 * fVar1;
          local_1180._4_4_ = fVar102 * fVar2;
          local_1180._8_4_ = fVar103 * fVar16;
          local_1180._12_4_ = fVar104 * fVar17;
          local_1180._16_4_ = fVar18 * 0.0;
          local_1180._20_4_ = fVar19 * 0.0;
          local_1180._24_4_ = fVar20 * 0.0;
          local_1180._28_4_ = 0;
          auVar64._8_4_ = 0x7f800000;
          auVar64._0_8_ = 0x7f8000007f800000;
          auVar64._12_4_ = 0x7f800000;
          auVar64._16_4_ = 0x7f800000;
          auVar64._20_4_ = 0x7f800000;
          auVar64._24_4_ = 0x7f800000;
          auVar64._28_4_ = 0x7f800000;
          auVar96 = vblendvps_avx(auVar64,local_11e0,auVar96);
          auVar65 = vshufps_avx(auVar96,auVar96,0xb1);
          auVar65 = vminps_avx(auVar96,auVar65);
          auVar76 = vshufpd_avx(auVar65,auVar65,5);
          auVar65 = vminps_avx(auVar65,auVar76);
          auVar76 = vpermpd_avx2(auVar65,0x4e);
          auVar65 = vminps_avx(auVar65,auVar76);
          auVar96 = vcmpps_avx(auVar96,auVar65,0);
          auVar70 = vpackssdw_avx(auVar96._0_16_,auVar96._16_16_);
          auVar71 = vpand_avx(auVar70,auVar71);
          auVar96 = vpmovzxwd_avx2(auVar71);
          auVar65 = vpslld_avx2(auVar96,0x1f);
          auVar96 = local_14a0;
          if ((((((((auVar65 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar65 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar65 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar65 >> 0x7f,0) != '\0') ||
                (auVar65 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar65 >> 0xbf,0) != '\0') ||
              (auVar65 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar65[0x1f] < '\0') {
            auVar96 = vpsrad_avx2(auVar65,0x1f);
          }
          auVar101 = ZEXT3264(auVar96);
LAB_0160cd34:
          uVar35 = vmovmskps_avx(auVar101._0_32_);
          uVar39 = 0;
          for (; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x80000000) {
            uVar39 = uVar39 + 1;
          }
          uVar40 = (ulong)uVar39;
          uVar35 = *(uint *)((long)&local_10e0 + uVar40 * 4);
          pGVar10 = (pSVar8->geometries).items[uVar35].ptr;
          if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
            *(undefined4 *)(local_14a0 + uVar40 * 4) = 0;
          }
          else {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              uVar40 = (ulong)(uVar39 << 2);
              uVar119 = *(undefined4 *)(local_1220 + uVar40);
              uVar3 = *(undefined4 *)(local_1200 + uVar40);
              *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_11e0 + uVar40);
              *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_11c0 + uVar40);
              *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_11a0 + uVar40);
              *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_1180 + uVar40);
              *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar119;
              *(undefined4 *)(ray + k * 4 + 0x200) = uVar3;
              *(undefined4 *)(ray + k * 4 + 0x220) = *(undefined4 *)((long)&local_1340 + uVar40);
              *(uint *)(ray + k * 4 + 0x240) = uVar35;
              *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
              goto LAB_0160cb21;
            }
            local_1480 = auVar97._0_32_;
            local_14c0 = auVar68._0_32_;
            uVar43 = (ulong)(uVar39 * 4);
            uVar119 = *(undefined4 *)(local_1220 + uVar43);
            local_1060._4_4_ = uVar119;
            local_1060._0_4_ = uVar119;
            local_1060._8_4_ = uVar119;
            local_1060._12_4_ = uVar119;
            local_1060._16_4_ = uVar119;
            local_1060._20_4_ = uVar119;
            local_1060._24_4_ = uVar119;
            local_1060._28_4_ = uVar119;
            local_1040 = *(undefined4 *)(local_1200 + uVar43);
            uVar119 = *(undefined4 *)((long)&local_1340 + uVar43);
            auVar82._4_4_ = uVar119;
            auVar82._0_4_ = uVar119;
            auVar82._8_4_ = uVar119;
            auVar82._12_4_ = uVar119;
            auVar84._16_4_ = uVar119;
            auVar84._0_16_ = auVar82;
            auVar84._20_4_ = uVar119;
            auVar84._24_4_ = uVar119;
            auVar84._28_4_ = uVar119;
            uVar119 = *(undefined4 *)(local_11c0 + uVar43);
            uVar3 = *(undefined4 *)(local_11a0 + uVar43);
            local_10a0._4_4_ = uVar3;
            local_10a0._0_4_ = uVar3;
            local_10a0._8_4_ = uVar3;
            local_10a0._12_4_ = uVar3;
            local_10a0._16_4_ = uVar3;
            local_10a0._20_4_ = uVar3;
            local_10a0._24_4_ = uVar3;
            local_10a0._28_4_ = uVar3;
            uVar3 = *(undefined4 *)(local_1180 + uVar43);
            local_1080._4_4_ = uVar3;
            local_1080._0_4_ = uVar3;
            local_1080._8_4_ = uVar3;
            local_1080._12_4_ = uVar3;
            local_1080._16_4_ = uVar3;
            local_1080._20_4_ = uVar3;
            local_1080._24_4_ = uVar3;
            local_1080._28_4_ = uVar3;
            auVar75._4_4_ = uVar35;
            auVar75._0_4_ = uVar35;
            auVar75._8_4_ = uVar35;
            auVar75._12_4_ = uVar35;
            auVar79._16_4_ = uVar35;
            auVar79._0_16_ = auVar75;
            auVar79._20_4_ = uVar35;
            auVar79._24_4_ = uVar35;
            auVar79._28_4_ = uVar35;
            local_10c0[0] = (RTCHitN)(char)uVar119;
            local_10c0[1] = (RTCHitN)(char)((uint)uVar119 >> 8);
            local_10c0[2] = (RTCHitN)(char)((uint)uVar119 >> 0x10);
            local_10c0[3] = (RTCHitN)(char)((uint)uVar119 >> 0x18);
            local_10c0[4] = (RTCHitN)(char)uVar119;
            local_10c0[5] = (RTCHitN)(char)((uint)uVar119 >> 8);
            local_10c0[6] = (RTCHitN)(char)((uint)uVar119 >> 0x10);
            local_10c0[7] = (RTCHitN)(char)((uint)uVar119 >> 0x18);
            local_10c0[8] = (RTCHitN)(char)uVar119;
            local_10c0[9] = (RTCHitN)(char)((uint)uVar119 >> 8);
            local_10c0[10] = (RTCHitN)(char)((uint)uVar119 >> 0x10);
            local_10c0[0xb] = (RTCHitN)(char)((uint)uVar119 >> 0x18);
            local_10c0[0xc] = (RTCHitN)(char)uVar119;
            local_10c0[0xd] = (RTCHitN)(char)((uint)uVar119 >> 8);
            local_10c0[0xe] = (RTCHitN)(char)((uint)uVar119 >> 0x10);
            local_10c0[0xf] = (RTCHitN)(char)((uint)uVar119 >> 0x18);
            local_10c0[0x10] = (RTCHitN)(char)uVar119;
            local_10c0[0x11] = (RTCHitN)(char)((uint)uVar119 >> 8);
            local_10c0[0x12] = (RTCHitN)(char)((uint)uVar119 >> 0x10);
            local_10c0[0x13] = (RTCHitN)(char)((uint)uVar119 >> 0x18);
            local_10c0[0x14] = (RTCHitN)(char)uVar119;
            local_10c0[0x15] = (RTCHitN)(char)((uint)uVar119 >> 8);
            local_10c0[0x16] = (RTCHitN)(char)((uint)uVar119 >> 0x10);
            local_10c0[0x17] = (RTCHitN)(char)((uint)uVar119 >> 0x18);
            local_10c0[0x18] = (RTCHitN)(char)uVar119;
            local_10c0[0x19] = (RTCHitN)(char)((uint)uVar119 >> 8);
            local_10c0[0x1a] = (RTCHitN)(char)((uint)uVar119 >> 0x10);
            local_10c0[0x1b] = (RTCHitN)(char)((uint)uVar119 >> 0x18);
            local_10c0[0x1c] = (RTCHitN)(char)uVar119;
            local_10c0[0x1d] = (RTCHitN)(char)((uint)uVar119 >> 8);
            local_10c0[0x1e] = (RTCHitN)(char)((uint)uVar119 >> 0x10);
            local_10c0[0x1f] = (RTCHitN)(char)((uint)uVar119 >> 0x18);
            uStack_103c = local_1040;
            uStack_1038 = local_1040;
            uStack_1034 = local_1040;
            uStack_1030 = local_1040;
            uStack_102c = local_1040;
            uStack_1028 = local_1040;
            uStack_1024 = local_1040;
            local_1020 = auVar84;
            local_1000 = auVar79;
            vpcmpeqd_avx2(local_1060,local_1060);
            uStack_fdc = context->user->instID[0];
            local_fe0 = uStack_fdc;
            uStack_fd8 = uStack_fdc;
            uStack_fd4 = uStack_fdc;
            uStack_fd0 = uStack_fdc;
            uStack_fcc = uStack_fdc;
            uStack_fc8 = uStack_fdc;
            uStack_fc4 = uStack_fdc;
            uStack_fbc = context->user->instPrimID[0];
            local_fc0 = uStack_fbc;
            uStack_fb8 = uStack_fbc;
            uStack_fb4 = uStack_fbc;
            uStack_fb0 = uStack_fbc;
            uStack_fac = uStack_fbc;
            uStack_fa8 = uStack_fbc;
            uStack_fa4 = uStack_fbc;
            *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_11e0 + uVar43);
            local_1460 = local_1140;
            local_14f0.valid = (int *)local_1460;
            local_14f0.geometryUserPtr = pGVar10->userPtr;
            local_14f0.context = context->user;
            local_14f0.hit = local_10c0;
            local_14f0.N = 8;
            local_14f0.ray = (RTCRayN *)ray;
            if (pGVar10->intersectionFilterN != (RTCFilterFunctionN)0x0) {
              auVar79 = ZEXT1632(auVar75);
              auVar84 = ZEXT1632(auVar82);
              (*pGVar10->intersectionFilterN)(&local_14f0);
            }
            auVar65 = vpcmpeqd_avx2(local_1460,_DAT_01f7b000);
            auVar96 = _DAT_01f7b020 & ~auVar65;
            if ((((((((auVar96 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar96 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar96 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar96 >> 0x7f,0) == '\0') &&
                  (auVar96 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar96 >> 0xbf,0) == '\0') &&
                (auVar96 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar96[0x1f]) {
              auVar65 = auVar65 ^ _DAT_01f7b020;
            }
            else {
              p_Var14 = context->args->filter;
              if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar10->field_8).field_0x2 & 0x40) != 0))))
              {
                auVar79 = ZEXT1632(auVar79._0_16_);
                auVar84 = ZEXT1632(auVar84._0_16_);
                (*p_Var14)(&local_14f0);
              }
              auVar76 = vpcmpeqd_avx2(local_1460,_DAT_01f7b000);
              auVar96 = vpcmpeqd_avx2(auVar84,auVar84);
              auVar65 = auVar76 ^ auVar96;
              auVar73 = vpcmpeqd_avx2(auVar79,auVar79);
              auVar96 = auVar96 & ~auVar76;
              if ((((((((auVar96 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar96 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar96 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar96 >> 0x7f,0) != '\0') ||
                    (auVar96 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar96 >> 0xbf,0) != '\0') ||
                  (auVar96 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar96[0x1f] < '\0') {
                auVar76 = auVar76 ^ auVar73;
                auVar96 = vmaskmovps_avx(auVar76,*(undefined1 (*) [32])local_14f0.hit);
                *(undefined1 (*) [32])(local_14f0.ray + 0x180) = auVar96;
                auVar96 = vmaskmovps_avx(auVar76,*(undefined1 (*) [32])(local_14f0.hit + 0x20));
                *(undefined1 (*) [32])(local_14f0.ray + 0x1a0) = auVar96;
                auVar96 = vmaskmovps_avx(auVar76,*(undefined1 (*) [32])(local_14f0.hit + 0x40));
                *(undefined1 (*) [32])(local_14f0.ray + 0x1c0) = auVar96;
                auVar96 = vmaskmovps_avx(auVar76,*(undefined1 (*) [32])(local_14f0.hit + 0x60));
                *(undefined1 (*) [32])(local_14f0.ray + 0x1e0) = auVar96;
                auVar96 = vmaskmovps_avx(auVar76,*(undefined1 (*) [32])(local_14f0.hit + 0x80));
                *(undefined1 (*) [32])(local_14f0.ray + 0x200) = auVar96;
                auVar96 = vpmaskmovd_avx2(auVar76,*(undefined1 (*) [32])(local_14f0.hit + 0xa0));
                *(undefined1 (*) [32])(local_14f0.ray + 0x220) = auVar96;
                auVar96 = vpmaskmovd_avx2(auVar76,*(undefined1 (*) [32])(local_14f0.hit + 0xc0));
                *(undefined1 (*) [32])(local_14f0.ray + 0x240) = auVar96;
                auVar96 = vpmaskmovd_avx2(auVar76,*(undefined1 (*) [32])(local_14f0.hit + 0xe0));
                *(undefined1 (*) [32])(local_14f0.ray + 0x260) = auVar96;
                auVar96 = vpmaskmovd_avx2(auVar76,*(undefined1 (*) [32])(local_14f0.hit + 0x100));
                *(undefined1 (*) [32])(local_14f0.ray + 0x280) = auVar96;
              }
            }
            if ((((((((auVar65 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar65 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar65 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar65 >> 0x7f,0) == '\0') &&
                  (auVar65 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar65 >> 0xbf,0) == '\0') &&
                (auVar65 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar65[0x1f]) {
              *(undefined4 *)(ray + k * 4 + 0x100) = local_14c0._0_4_;
            }
            else {
              local_14c0 = ZEXT432(*(uint *)(ray + k * 4 + 0x100));
            }
            *(undefined4 *)(local_14a0 + uVar40 * 4) = 0;
            auVar68 = ZEXT3264(local_14c0);
            uVar119 = local_14c0._0_4_;
            auVar67._4_4_ = uVar119;
            auVar67._0_4_ = uVar119;
            auVar67._8_4_ = uVar119;
            auVar67._12_4_ = uVar119;
            auVar67._16_4_ = uVar119;
            auVar67._20_4_ = uVar119;
            auVar67._24_4_ = uVar119;
            auVar67._28_4_ = uVar119;
            auVar97 = ZEXT3264(local_1480);
            auVar96 = vcmpps_avx(local_1480,auVar67,2);
            local_14a0 = vandps_avx(auVar96,local_14a0);
          }
          auVar101 = ZEXT3264(local_14a0);
          if ((((((((local_14a0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (local_14a0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (local_14a0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(local_14a0 >> 0x7f,0) == '\0') &&
                (local_14a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(local_14a0 >> 0xbf,0) == '\0') &&
              (local_14a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < local_14a0[0x1f]) goto LAB_0160cb21;
          auVar66._8_4_ = 0x7f800000;
          auVar66._0_8_ = 0x7f8000007f800000;
          auVar66._12_4_ = 0x7f800000;
          auVar66._16_4_ = 0x7f800000;
          auVar66._20_4_ = 0x7f800000;
          auVar66._24_4_ = 0x7f800000;
          auVar66._28_4_ = 0x7f800000;
          auVar96 = vblendvps_avx(auVar66,auVar97._0_32_,local_14a0);
          auVar65 = vshufps_avx(auVar96,auVar96,0xb1);
          auVar65 = vminps_avx(auVar96,auVar65);
          auVar76 = vshufpd_avx(auVar65,auVar65,5);
          auVar65 = vminps_avx(auVar65,auVar76);
          auVar76 = vpermpd_avx2(auVar65,0x4e);
          auVar65 = vminps_avx(auVar65,auVar76);
          auVar96 = vcmpps_avx(auVar96,auVar65,0);
          auVar65 = local_14a0 & auVar96;
          if ((((((((auVar65 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar65 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar65 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar65 >> 0x7f,0) != '\0') ||
                (auVar65 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar65 >> 0xbf,0) != '\0') ||
              (auVar65 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar65[0x1f] < '\0') {
            auVar96 = vandps_avx(auVar96,local_14a0);
            auVar101 = ZEXT3264(auVar96);
          }
          goto LAB_0160cd34;
        }
      }
LAB_0160cb21:
      auVar97 = ZEXT1664(local_13e0);
      auVar101 = ZEXT1664(local_13f0);
      auVar107 = ZEXT1664(local_1400);
      auVar111 = ZEXT1664(local_1410);
      auVar114 = ZEXT1664(local_1420);
      auVar118 = ZEXT1664(local_1430);
      auVar122 = ZEXT1664(local_1440);
    }
    uVar119 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar68 = ZEXT1664(CONCAT412(uVar119,CONCAT48(uVar119,CONCAT44(uVar119,uVar119))));
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }